

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

CordRepBtree * absl::lts_20250127::cord_internal::CordRepBtree::CreateSlow(CordRep *rep)

{
  bool bVar1;
  Invoker<void,_absl::lts_20250127::cord_internal::CordRep_*,_unsigned_long,_unsigned_long> in_RCX;
  FunctionRef<void_(absl::lts_20250127::cord_internal::CordRep_*,_unsigned_long,_unsigned_long)>
  consume_fn;
  CordRep *local_38;
  VoidPtr local_30;
  anon_class_8_1_898f5b00 local_28;
  anon_class_8_1_898f5b00 consume;
  CordRepBtree *node;
  CordRep *rep_local;
  
  bVar1 = CordRep::IsBtree(rep);
  if (bVar1) {
    rep_local = &CordRep::btree(rep)->super_CordRep;
  }
  else {
    consume.node = (CordRepBtree **)0x0;
    local_28.node = (CordRepBtree **)&consume;
    FunctionRef<void(absl::lts_20250127::cord_internal::CordRep*,unsigned_long,unsigned_long)>::
    FunctionRef<absl::lts_20250127::cord_internal::CordRepBtree::CreateSlow(absl::lts_20250127::cord_internal::CordRep*)::__0,void>
              ((FunctionRef<void(absl::lts_20250127::cord_internal::CordRep*,unsigned_long,unsigned_long)>
                *)&local_38,&local_28);
    consume_fn.invoker_ = in_RCX;
    consume_fn.ptr_.obj = local_30.obj;
    Consume((cord_internal *)rep,local_38,consume_fn);
    rep_local = (CordRep *)consume.node;
  }
  return (CordRepBtree *)rep_local;
}

Assistant:

CordRepBtree* CordRepBtree::CreateSlow(CordRep* rep) {
  if (rep->IsBtree()) return rep->btree();

  CordRepBtree* node = nullptr;
  auto consume = [&node](CordRep* r, size_t offset, size_t length) {
    r = MakeSubstring(r, offset, length);
    if (node == nullptr) {
      node = New(r);
    } else {
      node = CordRepBtree::AddCordRep<kBack>(node, r);
    }
  };
  Consume(rep, consume);
  return node;
}